

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit-pprint.cc
# Opt level: O0

void value_type_pprint_test(void)

{
  bool bVar1;
  normal3f *v_00;
  undefined1 local_1f8 [8];
  string s;
  normal3f v;
  stringstream local_190 [4];
  Interpolation interp;
  stringstream ss;
  ostream local_180 [376];
  
  std::__cxx11::stringstream::stringstream(local_190);
  std::operator<<(local_180,Vertex);
  std::__cxx11::stringstream::str();
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v.z,
                          "vertex");
  acutest_check_(bVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-pprint.cc"
                 ,0x16,"%s","ss.str() == \"vertex\"");
  std::__cxx11::string::~string((string *)&v.z);
  std::__cxx11::stringstream::~stringstream(local_190);
  s.field_2._8_8_ = 0x400000003f800000;
  v.x = 3.0;
  tinyusdz::to_string_abi_cxx11_((string *)local_1f8,(tinyusdz *)(s.field_2._M_local_buf + 8),v_00);
  bVar1 = std::operator==((string *)local_1f8,"(1, 2, 3)");
  acutest_check_(bVar1,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-pprint.cc"
                 ,0x1c,"%s","s == \"(1, 2, 3)\"");
  std::__cxx11::string::~string((string *)local_1f8);
  return;
}

Assistant:

void value_type_pprint_test(void) {

  {
    std::stringstream ss;
    tinyusdz::Interpolation interp = tinyusdz::Interpolation::Vertex;
    ss << interp;
    TEST_CHECK(ss.str() == "vertex");
  }

  {
    value::normal3f v{1.0f, 2.0f, 3.f};
    std::string s = to_string(v);
    TEST_CHECK(s == "(1, 2, 3)");
  }
}